

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O1

void __thiscall
agge::tests::VectorRasterizerTests::
InterCellNegativelyInclinedTwoShortHLinesProducePositiveCoverAndArea(VectorRasterizerTests *this)

{
  cell reference [2];
  vector_rasterizer vr;
  string local_e8;
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [16];
  LocationInfo local_b0;
  vector_rasterizer local_88;
  
  vector_rasterizer::vector_rasterizer(&local_88);
  vector_rasterizer::line(&local_88,0x133,0x1e6,0x180,0x2c);
  local_c8._0_2_ = 1;
  local_c8._2_2_ = 1;
  local_c8._4_4_ = -0x7f94;
  auStack_c0._0_2_ = -0xe6;
  auStack_c0._2_2_ = 1;
  auStack_c0._4_4_ = 0x4aa40000;
  auStack_c0._8_4_ = 0xff2cffff;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_b0,&local_e8,0x352);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,2ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            ((cell (*) [2])local_c8,&local_88._cells,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.filename._M_dataplus._M_p != &local_b0.filename.field_2) {
    operator_delete(local_b0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_88._x_sorted_cells._begin != (cell *)0x0) {
    operator_delete__(local_88._x_sorted_cells._begin);
  }
  if (local_88._histogram_x._begin != (uint *)0x0) {
    operator_delete__(local_88._histogram_x._begin);
  }
  if (local_88._histogram_y._begin != (uint *)0x0) {
    operator_delete__(local_88._histogram_y._begin);
  }
  if (local_88._cells._begin != (cell *)0x0) {
    operator_delete__(local_88._cells._begin);
  }
  return;
}

Assistant:

test( InterCellNegativelyInclinedTwoShortHLinesProducePositiveCoverAndArea )
			{
				// INIT
				vector_rasterizer vr;

				// ACT (ctg = -713)
				vr.line(fp(1.2), fp(1.9), fp(1.5), fp(0.17)); // in fp - [(307, 486); (384, 44)), v(77, -442)

				// ASSERT
				const vector_rasterizer::cell reference[] = {
					{ 1, 1, -32660, -230 }, // dx = 40
					{ 1, 0, -46428, -212 }, // dx = 37
				};

				assert_equal(reference, vr.cells());
			}